

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

void google::protobuf::anon_unknown_21::CollectEditions
               (Descriptor *descriptor,Edition maximum_edition,
               btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
               *editions)

{
  bool bVar1;
  int iVar2;
  Edition EVar3;
  FieldDescriptor *this;
  FieldOptions *this_00;
  FieldOptions_FeatureSupport *pFVar4;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_01;
  reference this_02;
  FieldOptions_EditionDefault *def;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *__range3;
  FieldOptions *options;
  int i;
  btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
  *editions_local;
  Edition maximum_edition_local;
  Descriptor *descriptor_local;
  
  for (options._4_4_ = 0; iVar2 = Descriptor::field_count(descriptor), options._4_4_ < iVar2;
      options._4_4_ = options._4_4_ + 1) {
    this = Descriptor::field(descriptor,options._4_4_);
    this_00 = FieldDescriptor::options(this);
    pFVar4 = FieldOptions::feature_support(this_00);
    EVar3 = FieldOptions_FeatureSupport::edition_introduced(pFVar4);
    MaybeInsertEdition(EVar3,maximum_edition,editions);
    pFVar4 = FieldOptions::feature_support(this_00);
    bVar1 = FieldOptions_FeatureSupport::has_edition_removed(pFVar4);
    if (bVar1) {
      pFVar4 = FieldOptions::feature_support(this_00);
      EVar3 = FieldOptions_FeatureSupport::edition_removed(pFVar4);
      MaybeInsertEdition(EVar3,maximum_edition,editions);
    }
    this_01 = FieldOptions::edition_defaults(this_00);
    __end3 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::begin(this_01);
    def = (FieldOptions_EditionDefault *)
          RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(this_01);
    while (bVar1 = internal::operator!=(&__end3,(iterator *)&def), bVar1) {
      this_02 = internal::RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>::
                operator*(&__end3);
      EVar3 = FieldOptions_EditionDefault::edition(this_02);
      MaybeInsertEdition(EVar3,maximum_edition,editions);
      internal::RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>::operator++
                (&__end3);
    }
  }
  return;
}

Assistant:

void CollectEditions(const Descriptor& descriptor, Edition maximum_edition,
                     absl::btree_set<Edition>& editions) {
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldOptions& options = descriptor.field(i)->options();
    // Editions where a new feature is introduced should be captured.
    MaybeInsertEdition(options.feature_support().edition_introduced(),
                       maximum_edition, editions);

    // Editions where a feature is removed should be captured.
    if (options.feature_support().has_edition_removed()) {
      MaybeInsertEdition(options.feature_support().edition_removed(),
                         maximum_edition, editions);
    }

    // Any edition where a default value changes should be captured.
    for (const auto& def : options.edition_defaults()) {
      MaybeInsertEdition(def.edition(), maximum_edition, editions);
    }
  }
}